

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtres(emtcxdef *ctx,ushort bytes)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  short in_SI;
  long in_RDI;
  ushort newsiz;
  ushort need;
  ushort oldsiz;
  ushort in_stack_0000018c;
  mcmon in_stack_0000018e;
  mcmcxdef *in_stack_00000190;
  char *in_stack_ffffffffffffffe8;
  
  uVar1 = *(ushort *)
           (*(long *)(*(long *)**(undefined8 **)(in_RDI + 8) +
                     (long)((int)(uint)*(ushort *)
                                        (*(long *)(*(long *)(in_RDI + 8) + 0x30 +
                                                  (long)((int)(uint)*(ushort *)(in_RDI + 0x10) >> 8)
                                                  * 8) +
                                        (long)(int)(*(ushort *)(in_RDI + 0x10) & 0xff) * 2) >> 8) *
                     8) +
            (long)(int)(*(ushort *)
                         (*(long *)(*(long *)(in_RDI + 8) + 0x30 +
                                   (long)((int)(uint)*(ushort *)(in_RDI + 0x10) >> 8) * 8) +
                         (long)(int)(*(ushort *)(in_RDI + 0x10) & 0xff) * 2) & 0xff) * 0x20 + 0x18);
  sVar2 = *(short *)(in_RDI + 0x12) + in_SI;
  uVar3 = sVar2 + 1;
  if (uVar1 < uVar3) {
    uVar4 = sVar2 + 0x101;
    if (uVar4 < uVar1) {
      errsigf((errcxdef *)CONCAT26(in_SI,CONCAT24(uVar1,CONCAT22(uVar3,uVar4))),
              in_stack_ffffffffffffffe8,0);
    }
    puVar5 = mcmrealo(in_stack_00000190,in_stack_0000018e,in_stack_0000018c);
    *(uchar **)(in_RDI + 0x18) = puVar5;
  }
  return;
}

Assistant:

void emtres(emtcxdef *ctx, ushort bytes)
{
    ushort oldsiz = mcmobjsiz(ctx->emtcxmem, ctx->emtcxobj);
    ushort need;
    
    need = ctx->emtcxofs + bytes + 1;
    
    if (need > oldsiz)
    {
        ushort newsiz;
        
        newsiz = need + EMTINC;
        if (newsiz < oldsiz) errsig(ctx->emtcxerr, ERR_OBJOVF);
        ctx->emtcxptr = mcmrealo(ctx->emtcxmem, ctx->emtcxobj, newsiz);
        assert(mcmobjsiz(ctx->emtcxmem, ctx->emtcxobj) >= need);
    }
}